

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall CppGenerator::computeParallelizeGroup(CppGenerator *this,bool paralleize_groups)

{
  undefined1 auVar1 [16];
  uint uVar2;
  size_type sVar3;
  void *pvVar4;
  ulong uVar5;
  reference this_00;
  unsigned_long *puVar6;
  byte in_SIL;
  long in_RDI;
  TDNode *node;
  size_t gid;
  size_t in_stack_ffffffffffffff88;
  TreeDecomposition *in_stack_ffffffffffffff90;
  ulong local_28;
  TDNode *local_20;
  ulong local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  sVar3 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0xf0));
  pvVar4 = operator_new__(sVar3);
  memset(pvVar4,0,sVar3);
  *(void **)(in_RDI + 0x120) = pvVar4;
  sVar3 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0xf0));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar3;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar5);
  memset(pvVar4,0,uVar5);
  *(void **)(in_RDI + 0x128) = pvVar4;
  if ((local_9 & 1) != 0) {
    for (local_18 = 0; uVar5 = local_18,
        sVar3 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        *)(in_RDI + 0xf0)), uVar5 < sVar3; local_18 = local_18 + 1) {
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2839a0);
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2839b3);
      this_00 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)(in_RDI + 0xf0),local_18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,0);
      QueryCompiler::getView((QueryCompiler *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_20 = TreeDecomposition::getRelation(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
      ;
      if (1 < local_20->_threads) {
        *(undefined1 *)(*(long *)(in_RDI + 0x120) + local_18) = 1;
        in_stack_ffffffffffffff90 = (TreeDecomposition *)&local_20->_threads;
        uVar2 = std::thread::hardware_concurrency();
        local_28 = (ulong)uVar2;
        puVar6 = std::min<unsigned_long>((unsigned_long *)in_stack_ffffffffffffff90,&local_28);
        *(unsigned_long *)(*(long *)(in_RDI + 0x128) + local_18 * 8) = *puVar6;
      }
    }
  }
  return;
}

Assistant:

void CppGenerator::computeParallelizeGroup(bool paralleize_groups)
{
    _parallelizeGroup = new bool[viewGroups.size()]();
    _threadsPerGroup = new size_t[viewGroups.size()]();

    if (!paralleize_groups)
        return;
    
    for (size_t gid = 0; gid < viewGroups.size(); ++gid)
    {
        TDNode* node = _td->getRelation(_qc->getView(viewGroups[gid][0])->_origin);

        if (node->_threads > 1)
        {
            _parallelizeGroup[gid] = true;            
            _threadsPerGroup[gid] =
                std::min(node->_threads, (size_t)std::thread::hardware_concurrency());
        }        
    }
}